

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint zlib_compress(uchar **out,size_t *outsize,uchar *in,size_t insize,
                  LodePNGCompressSettings *settings)

{
  uint uVar1;
  uchar *puVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  size_t sStack_40;
  uchar *puStack_38;
  
  if (settings->custom_zlib !=
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar1 = (*settings->custom_zlib)(out,outsize,in,insize,settings);
    if (uVar1 != 0) {
      uVar1 = 0x6f;
    }
    return uVar1;
  }
  puStack_38 = (uchar *)0x0;
  sStack_40 = 0;
  if (settings->custom_deflate ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar1 = lodepng_deflate(&puStack_38,&sStack_40,in,insize,settings);
    *out = (uchar *)0x0;
    *outsize = 0;
    if (uVar1 != 0) goto LAB_001c60b4;
  }
  else {
    uVar1 = (*settings->custom_deflate)(&puStack_38,&sStack_40,in,insize,settings);
    if (uVar1 != 0) {
      *out = (uchar *)0x0;
      *outsize = 0;
      uVar1 = 0x6f;
      goto LAB_001c60b4;
    }
  }
  sVar3 = sStack_40;
  *outsize = sStack_40 + 6;
  puVar2 = (uchar *)malloc(sStack_40 + 6);
  *out = puVar2;
  if (puVar2 == (uchar *)0x0) {
    uVar1 = 0x53;
  }
  else {
    if ((int)insize == 0) {
      uVar1 = 1;
    }
    else {
      uVar1 = 1;
      uVar4 = 0;
      do {
        uVar8 = (uint)insize;
        uVar5 = 0x15b0;
        if (uVar8 < 0x15b0) {
          uVar5 = uVar8;
        }
        uVar6 = uVar8;
        if (0x15af < (insize & 0xffffffff)) {
          uVar6 = 0x15b0;
        }
        lVar7 = 0;
        do {
          uVar1 = uVar1 + in[lVar7];
          uVar4 = uVar4 + uVar1;
          lVar7 = lVar7 + 1;
        } while (uVar6 != (uint)lVar7);
        in = in + uVar5;
        uVar1 = uVar1 % 0xfff1;
        uVar4 = uVar4 % 0xfff1;
        insize = (size_t)(uVar8 - uVar5);
      } while (uVar8 - uVar5 != 0);
      uVar1 = uVar4 << 0x10 | uVar1;
    }
    puVar2[0] = 'x';
    puVar2[1] = '\x01';
    if (sVar3 == 0) {
      sVar3 = 6;
    }
    else {
      sVar3 = 0;
      do {
        (*out)[sVar3 + 2] = puStack_38[sVar3];
        sVar3 = sVar3 + 1;
      } while (sVar3 != sStack_40);
      puVar2 = *out;
      sVar3 = *outsize;
    }
    *(uint *)(puVar2 + (sVar3 - 4)) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = 0;
  }
LAB_001c60b4:
  free(puStack_38);
  return uVar1;
}

Assistant:

static unsigned zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                              size_t insize, const LodePNGCompressSettings* settings) {
  if(settings->custom_zlib) {
    unsigned error = settings->custom_zlib(out, outsize, in, insize, settings);
    /*the custom zlib is allowed to have its own error codes, however, we translate it to code 111*/
    return error ? 111 : 0;
  } else {
    return lodepng_zlib_compress(out, outsize, in, insize, settings);
  }
}